

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O2

Vec_Ptr_t * Saig_ManDetectConstrCheckCont(Vec_Ptr_t *vSuper,Vec_Ptr_t *vSuper2)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *p;
  int iVar3;
  
  iVar3 = 0;
  do {
    if (vSuper2->nSize <= iVar3) {
      p = Vec_PtrAlloc(100);
      for (iVar3 = 0; iVar3 < vSuper->nSize; iVar3 = iVar3 + 1) {
        pvVar2 = Vec_PtrEntry(vSuper,iVar3);
        iVar1 = Vec_PtrFind(vSuper2,pvVar2);
        if (iVar1 == -1) {
          Vec_PtrPush(p,pvVar2);
        }
      }
      return p;
    }
    pvVar2 = Vec_PtrEntry(vSuper2,iVar3);
    iVar1 = Vec_PtrFind(vSuper,pvVar2);
    iVar3 = iVar3 + 1;
  } while (iVar1 != -1);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Saig_ManDetectConstrCheckCont( Vec_Ptr_t * vSuper, Vec_Ptr_t * vSuper2 )
{
    Vec_Ptr_t * vUnique;
    Aig_Obj_t * pObj, * pObj2;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper2, pObj2, i )
        if ( Vec_PtrFind( vSuper, pObj2 ) == -1 )
            return 0;
    vUnique = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        if ( Vec_PtrFind( vSuper2, pObj ) == -1 )
            Vec_PtrPush( vUnique, pObj );
    return vUnique;
}